

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

string * flatbuffers::NumToString<char>(string *__return_storage_ptr__,char t)

{
  undefined7 in_register_00000031;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::ostream::operator<<(local_188,(int)CONCAT71(in_register_00000031,t));
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

std::string NumToString(T t) {
  // to_string() prints different numbers of digits for floats depending on
  // platform and isn't available on Android, so we use stringstream
  std::stringstream ss;
  if (sizeof(T) > 1) ss << t;
  else ss << static_cast<int>(t);  // Avoid char types used as character data.
  return ss.str();
}